

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::build
          (BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *this)

{
  uint64_t *puVar1;
  BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *pBVar2;
  void *pvVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  double dVar7;
  undefined8 uVar8;
  char cVar9;
  size_t i;
  void *pvVar10;
  long lVar11;
  NodeRefPtr<4> root;
  runtime_error *prVar12;
  uint uVar13;
  size_t i_1;
  ulong uVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *bounds;
  BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *pBVar15;
  BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *pBVar16;
  BVHN<4> *pBVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 *puVar21;
  size_t size;
  ulong numPrimitives;
  BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *pBVar22;
  undefined1 auVar23 [16];
  anon_class_1_0_00000001 local_1b9;
  ulong local_1b8;
  double local_1b0;
  task_group_context context;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  blocked_range<unsigned_long> local_d0;
  PrimInfo pinfo;
  anon_class_8_1_8991fb9c local_60;
  anon_class_16_2_ed117de8_conflict33 local_58;
  anon_class_24_3_8ee612a4_conflict4 local_48;
  
  lVar11 = *(long *)(this + 0x28);
  uVar14 = *(ulong *)(*(long *)(this + 0x30) + 0x1d8);
  uVar18 = *(long *)(lVar11 + 0x208) - *(long *)(lVar11 + 0x200) >> 3;
  if (uVar14 < uVar18) {
    local_d0.my_end = (unsigned_long)this;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = 1;
    local_128._0_8_ = &local_d0;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = uVar18;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = uVar14;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)&pinfo,(anon_class_8_1_898bcfc2 *)&local_128.field_1,
               &context);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar9 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    lVar11 = *(long *)(this + 0x28);
  }
  FastAllocator::reset((FastAllocator *)(lVar11 + 0x78));
  lVar11 = *(long *)(this + 0x30);
  uVar18 = *(ulong *)(this + 0x98);
  uVar13 = (uint)uVar18;
  if ((uVar13 >> 0x14 & 1) == 0) {
    numPrimitives = 0;
  }
  else {
    numPrimitives = *(ulong *)(lVar11 + 0x290);
  }
  if ((uVar13 >> 0x15 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x2a0);
  }
  if ((uVar18 & 0xf) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x2c0);
  }
  if ((uVar18 & 0x77770) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x2b0);
  }
  if ((uVar18 & 0xe000000) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x340);
  }
  if ((uVar13 >> 0x17 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x2d0);
  }
  if ((uVar13 >> 0x1d & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x2e0);
  }
  if ((uVar13 >> 0x1e & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x2f0);
  }
  if ((int)uVar13 < 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x300);
  }
  if ((uVar13 >> 0x18 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 0x310);
  }
  if ((uVar13 >> 0x16 & 1) != 0) {
    numPrimitives = numPrimitives + *(long *)(lVar11 + 800);
  }
  if (numPrimitives == 0) {
    if (*(long *)(this + 0x70) != 0) {
      *(undefined8 *)(this + 0x70) = 0;
    }
    *(undefined8 *)(this + 0x70) = 0;
    context.my_cpu_ctl_env = 0x7f8000007f800000;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x7f800000;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x80;
    context.my_lifetime_state._M_i = 0x7f;
    context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
    context.my_context_list = (context_list *)0xff800000ff800000;
    context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    context.my_itt_caller = (void *)0xff800000ff800000;
    BVHN<4>::set(*(BVHN<4> **)(this + 0x28),(NodeRef)0x8,(LBBox3fa *)&context,0);
    return;
  }
  auVar23._8_4_ = (int)(numPrimitives >> 0x20);
  auVar23._0_8_ = numPrimitives;
  auVar23._12_4_ = 0x45300000;
  dVar7 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)numPrimitives) - 4503599627370496.0)) * 1.2 * 8.0;
  uVar18 = (ulong)dVar7;
  FastAllocator::init_estimate
            ((FastAllocator *)(*(long *)(this + 0x28) + 0x78),
             ((long)(dVar7 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) +
             (numPrimitives & 0xffffffffffffff) * 0x40);
  pBVar17 = *(BVHN<4> **)(this + 0x28);
  std::__cxx11::to_string((string *)&local_128.field_1,4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "sse2::BVH",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_128.field_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "BuilderTwoLevel");
  local_1b0 = BVHN<4>::preBuild(pBVar17,(string *)&context);
  std::__cxx11::string::~string((string *)&context);
  std::__cxx11::string::~string((string *)&pinfo);
  std::__cxx11::string::~string((string *)&local_128.field_1);
  lVar11 = *(long *)(this + 0x28);
  if ((ulong)(*(long *)(lVar11 + 0x208) - *(long *)(lVar11 + 0x200) >> 3) < uVar14) {
    std::vector<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>::resize
              ((vector<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_> *)(lVar11 + 0x200),
               uVar14);
  }
  if ((ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) < uVar14) {
    std::
    vector<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase>_>_>_>
    ::resize((vector<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderBase>_>_>_>
              *)(this + 0x10),uVar14);
  }
  resizeRefsList(this);
  LOCK();
  *(undefined4 *)(this + 0x88) = 0;
  UNLOCK();
  local_d0.my_end = (unsigned_long)this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = 0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = 1;
  local_128._0_8_ = &local_d0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = uVar14;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::range<unsigned_long>const&)_2_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::range<unsigned_long>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            ((blocked_range<unsigned_long> *)&pinfo,(anon_class_8_1_898bcfc2 *)&local_128.field_1,
             &context);
  cVar9 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar9 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  local_d0.my_end = (unsigned_long)this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = 0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = 1;
  local_128._0_8_ = &local_d0;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = uVar14;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::range<unsigned_long>const&)_3_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::range<unsigned_long>const&)_3_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            ((blocked_range<unsigned_long> *)&pinfo,(anon_class_8_1_898bcfc2 *)&local_128.field_1,
             &context);
  cVar9 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar9 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if (*(int *)(this + 0x88) == 1) {
    pBVar17 = *(BVHN<4> **)(this + 0x28);
    puVar1 = *(uint64_t **)(this + 0x58);
    root.ptr = puVar1[4];
    context.my_cpu_ctl_env = *puVar1;
    context._8_8_ = puVar1[1];
    context.field_6 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(puVar1 + 2);
    context.my_context_list = (context_list *)puVar1[3];
    bounds = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&context;
    context.my_node.my_prev_node = (intrusive_list_node *)context.my_cpu_ctl_env;
    context.my_node.my_next_node = (intrusive_list_node *)context._8_8_;
    context.my_exception._M_b._M_p = (__base_type)(__base_type)context.field_6;
    context.my_itt_caller = context.my_context_list;
    goto LAB_0053f614;
  }
  pBVar22 = (BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *)
            (long)*(int *)(this + 0x88);
  pBVar2 = *(BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> **)(this + 0x50);
  pBVar16 = pBVar2;
  if ((pBVar2 < pBVar22) &&
     (pBVar15 = pBVar2, pBVar16 = pBVar22,
     pBVar2 != (BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *)0x0)) {
    for (; pBVar16 = pBVar15, pBVar15 < pBVar22;
        pBVar15 = (BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *)
                  ((long)pBVar15 * 2 + (ulong)((long)pBVar15 * 2 == 0))) {
    }
  }
  if (pBVar22 < *(BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> **)(this + 0x48)) {
    *(BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> **)(this + 0x48) = pBVar22;
  }
  if (pBVar2 == pBVar16) {
    *(BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> **)(this + 0x48) = pBVar22;
  }
  else {
    pvVar3 = *(void **)(this + 0x58);
    if (pBVar16 == (BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *)0x0) {
      size = 0;
LAB_0053f213:
      pvVar10 = alignedMalloc(size,0x20);
    }
    else {
      size = (long)pBVar16 << 6;
      (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),size,0);
      if (size < 0x1c00000) goto LAB_0053f213;
      pvVar10 = os_malloc(size,(bool *)(this + 0x40));
    }
    lVar11 = 0x20;
    *(void **)(this + 0x58) = pvVar10;
    for (uVar14 = 0; uVar14 < *(ulong *)(this + 0x48); uVar14 = uVar14 + 1) {
      lVar4 = *(long *)(this + 0x58);
      puVar21 = (undefined8 *)((long)pvVar3 + lVar11 + -0x20);
      uVar8 = puVar21[1];
      puVar5 = (undefined8 *)(lVar4 + -0x20 + lVar11);
      *puVar5 = *puVar21;
      puVar5[1] = uVar8;
      puVar21 = (undefined8 *)((long)pvVar3 + lVar11 + -0x10);
      uVar8 = puVar21[1];
      puVar5 = (undefined8 *)(lVar4 + -0x10 + lVar11);
      *puVar5 = *puVar21;
      puVar5[1] = uVar8;
      *(undefined8 *)(lVar4 + lVar11) = *(undefined8 *)((long)pvVar3 + lVar11);
      *(undefined4 *)(lVar4 + 8 + lVar11) = *(undefined4 *)((long)pvVar3 + lVar11 + 8);
      lVar11 = lVar11 + 0x40;
    }
    lVar11 = *(long *)(this + 0x50);
    if (pvVar3 != (void *)0x0) {
      if ((ulong)(lVar11 << 6) < 0x1c00000) {
        alignedFree(pvVar3);
      }
      else {
        os_free(pvVar3,lVar11 << 6,(bool)this[0x40]);
      }
    }
    if (lVar11 != 0) {
      (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),lVar11 * -0x40,1);
    }
    *(BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> **)(this + 0x48) = pBVar22;
    *(BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> **)(this + 0x50) = pBVar16;
  }
  uVar14 = (ulong)((float)numPrimitives / 1000.0);
  uVar14 = (long)((float)numPrimitives / 1000.0 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  if (uVar14 < (ulong)((long)pBVar22 * 2)) {
    uVar14 = (long)pBVar22 * 2;
  }
  local_1b8 = 1000;
  if (1000 < uVar14) {
    local_1b8 = uVar14;
  }
  local_128._0_8_ = (blocked_range<unsigned_long> *)0x7f8000007f800000;
  local_128._8_8_ = 0x7f8000007f800000;
  local_118 = 0xff800000ff800000;
  uStack_110 = 0xff800000ff800000;
  local_108 = 0x7f8000007f800000;
  uStack_100 = 0x7f8000007f800000;
  local_f8 = 0xff800000ff800000;
  uStack_f0 = 0xff800000ff800000;
  local_e8 = 0;
  uStack_e0 = 0;
  local_48.func = &local_60;
  local_48.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_128;
  local_60.this = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)this;
  local_48.reduction = &local_1b9;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_d0.my_begin = 0;
  local_d0.my_grainsize = 1;
  local_d0.my_end = (unsigned_long)pBVar22;
  local_58.reduction = &local_1b9;
  local_58.func = &local_48;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_twolevel_cpp:146:16)>
            (&pinfo,&local_d0,(PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_128.field_1,
             &local_58,&local_1b9,&context);
  cVar9 = tbb::detail::r1::is_group_execution_cancelled(&context);
  uVar14 = local_1b8;
  if (cVar9 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if (pinfo.end == pinfo.begin) {
    pBVar17 = *(BVHN<4> **)(this + 0x28);
    bounds = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&context;
    context.my_cpu_ctl_env = 0x7f8000007f800000;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x7f800000;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x80;
    context.my_lifetime_state._M_i = 0x7f;
    context.field_6.my_parent = (task_group_context *)0xff800000ff800000;
    context.my_context_list = (context_list *)0xff800000ff800000;
    context.my_node.my_prev_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_node.my_next_node = (intrusive_list_node *)0x7f8000007f800000;
    context.my_exception._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    context.my_itt_caller = (void *)0xff800000ff800000;
    root.ptr = 8;
    numPrimitives = 0;
  }
  else {
    context.my_itt_caller = (void *)0xffffffffffffffff;
    context.my_cpu_ctl_env = 4;
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0x28;
    context.my_version = gold_2021U1;
    context.my_traits = (context_traits)0x0;
    context.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x0;
    context.my_lifetime_state._M_i = created;
    for (iVar6 = 0x1f; 4U >> iVar6 == 0; iVar6 = iVar6 + -1) {
    }
    context.field_6 = (anon_union_8_2_d71db6ad_for_task_group_context_11)(long)iVar6;
    context.my_context_list = (context_list *)0x1;
    context.my_node.my_prev_node = (intrusive_list_node *)0x1;
    context.my_node.my_next_node = (intrusive_list_node *)0x3f8000003f800000;
    context.my_exception._M_b._M_p = *(__base_type *)(this + 0x90);
    uVar18 = *(ulong *)(this + 0x50);
    uVar20 = uVar18;
    if ((uVar18 < uVar14) && (uVar19 = uVar18, uVar20 = uVar14, uVar18 != 0)) {
      for (; uVar20 = uVar19, uVar19 < uVar14; uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
      }
    }
    if (uVar14 < *(ulong *)(this + 0x48)) {
      *(ulong *)(this + 0x48) = uVar14;
    }
    if (uVar18 == uVar20) {
      *(ulong *)(this + 0x48) = uVar14;
    }
    else {
      pvVar3 = *(void **)(this + 0x58);
      uVar14 = uVar20 << 6;
      (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),uVar14,0);
      if (uVar14 < 0x1c00000) {
        pvVar10 = alignedMalloc(uVar14,0x20);
      }
      else {
        pvVar10 = os_malloc(uVar14,(bool *)(this + 0x40));
      }
      *(void **)(this + 0x58) = pvVar10;
      lVar11 = 0x20;
      for (uVar14 = 0; uVar14 < *(ulong *)(this + 0x48); uVar14 = uVar14 + 1) {
        lVar4 = *(long *)(this + 0x58);
        puVar21 = (undefined8 *)((long)pvVar3 + lVar11 + -0x20);
        uVar8 = puVar21[1];
        puVar5 = (undefined8 *)(lVar4 + -0x20 + lVar11);
        *puVar5 = *puVar21;
        puVar5[1] = uVar8;
        puVar21 = (undefined8 *)((long)pvVar3 + lVar11 + -0x10);
        uVar8 = puVar21[1];
        puVar5 = (undefined8 *)(lVar4 + -0x10 + lVar11);
        *puVar5 = *puVar21;
        puVar5[1] = uVar8;
        *(undefined8 *)(lVar4 + lVar11) = *(undefined8 *)((long)pvVar3 + lVar11);
        *(undefined4 *)(lVar4 + 8 + lVar11) = *(undefined4 *)((long)pvVar3 + lVar11 + 8);
        lVar11 = lVar11 + 0x40;
      }
      lVar11 = *(long *)(this + 0x50);
      if (pvVar3 != (void *)0x0) {
        if ((ulong)(lVar11 << 6) < 0x1c00000) {
          alignedFree(pvVar3);
        }
        else {
          os_free(pvVar3,lVar11 << 6,(bool)this[0x40]);
        }
      }
      if (lVar11 != 0) {
        (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),lVar11 * -0x40,1);
      }
      *(ulong *)(this + 0x48) = local_1b8;
      *(ulong *)(this + 0x50) = uVar20;
      uVar14 = local_1b8;
    }
    root = BVHBuilderBinnedOpenMergeSAH::
           build<embree::NodeRefPtr<4>,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::BuildRef,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::BuildRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::BuildRef&,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::BuildRef*)_1_,embree::sse2::BVHNBuilderTwoLevel<4,embree::UserGeometry,embree::Object>::build()::_lambda(unsigned_long)_1_>
                     (*(long *)(this + 0x28) + 0x78,&local_128,this,this,
                      *(undefined8 *)(this + 0x58),uVar14,&pinfo,&context);
    pBVar17 = *(BVHN<4> **)(this + 0x28);
    local_128._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_128._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_118 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_110 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    local_108 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    uStack_100 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_f8 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_f0 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    bounds = &local_128;
  }
LAB_0053f614:
  BVHN<4>::set(pBVar17,(NodeRef)root.ptr,(LBBox3fa *)&bounds->field_1,numPrimitives);
  lVar11 = *(long *)(this + 0x28);
  FastAllocator::internal_fix_used_blocks((FastAllocator *)(lVar11 + 0x78));
  puVar5 = *(undefined8 **)(lVar11 + 0x1b0);
  for (puVar21 = *(undefined8 **)(lVar11 + 0x1a8); puVar21 != puVar5; puVar21 = puVar21 + 1) {
    FastAllocator::ThreadLocal2::unbind((ThreadLocal2 *)*puVar21,(FastAllocator *)(lVar11 + 0x78));
  }
  if (*(long *)(lVar11 + 0x1b0) != *(long *)(lVar11 + 0x1a8)) {
    *(long *)(lVar11 + 0x1b0) = *(long *)(lVar11 + 0x1a8);
  }
  BVHN<4>::postBuild(*(BVHN<4> **)(this + 0x28),local_1b0);
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::build()
    {
      /* delete some objects */
      size_t num = scene->size();
      if (num < bvh->objects.size()) {
        parallel_for(num, bvh->objects.size(), [&] (const range<size_t>& r) {
            for (size_t i=r.begin(); i<r.end(); i++) {
              builders[i].reset();
              delete bvh->objects[i]; bvh->objects[i] = nullptr;
            }
          });
      }
      
#if PROFILE
      while(1) 
#endif
      {
      /* reset memory allocator */
      bvh->alloc.reset();
      
      /* skip build for empty scene */
      const size_t numPrimitives = scene->getNumPrimitives(gtype,false);

      if (numPrimitives == 0) {
        prims.resize(0);
        bvh->set(BVH::emptyNode,empty,0);
        return;
      }

      /* calculate the size of the entire BVH */
      const size_t numLeafBlocks = Primitive::blocks(numPrimitives);
      const size_t node_bytes = 2*numLeafBlocks*sizeof(typename BVH::AABBNode)/N;
      const size_t leaf_bytes = size_t(1.2*numLeafBlocks*sizeof(Primitive));
      bvh->alloc.init_estimate(node_bytes+leaf_bytes); 

      double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "BuilderTwoLevel");

      /* resize object array if scene got larger */
      if (bvh->objects.size()  < num) bvh->objects.resize(num);
      if (builders.size() < num) builders.resize(num);
      resizeRefsList ();
      nextRef.store(0);
      
      /* create acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
      
          /* ignore meshes we do not support */
          if (mesh == nullptr || mesh->numTimeSteps != 1)
            continue;
          
          if (isSmallGeometry(mesh)) {
             setupSmallBuildRefBuilder (objectID, mesh);
          } else {
            setupLargeBuildRefBuilder (objectID, mesh);
          }
        }
      });

      /* parallel build of acceleration structures */
      parallel_for(size_t(0), num, [&] (const range<size_t>& r)
      {
        for (size_t objectID=r.begin(); objectID<r.end(); objectID++)
        {
          /* ignore if no triangle mesh or not enabled */
          Mesh* mesh = scene->getSafe<Mesh>(objectID);
          if (mesh == nullptr || !mesh->isEnabled() || mesh->numTimeSteps != 1) 
            continue;

          builders[objectID]->attachBuildRefs (this);
        }
      });


#if PROFILE
      double d0 = getSeconds();
#endif
      /* fast path for single geometry scenes */
      if (nextRef == 1) { 
        bvh->set(refs[0].node,LBBox3fa(refs[0].bounds()),numPrimitives);
      }

      else
      {     
        /* open all large nodes */
        refs.resize(nextRef);

        /* this probably needs some more tuning */
        const size_t extSize = max(max((size_t)SPLIT_MIN_EXT_SPACE,refs.size()*SPLIT_MEMORY_RESERVE_SCALE),size_t((float)numPrimitives / SPLIT_MEMORY_RESERVE_FACTOR));
 
#if !ENABLE_DIRECT_SAH_MERGE_BUILDER

#if ENABLE_OPEN_SEQUENTIAL
        open_sequential(extSize); 
#endif
        /* compute PrimRefs */
        prims.resize(refs.size());
#endif
        
        {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER

          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
          
#else
          const PrimInfo pinfo = parallel_reduce(size_t(0), refs.size(),  PrimInfo(empty), [&] (const range<size_t>& r) -> PrimInfo {

              PrimInfo pinfo(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                pinfo.add_center2(refs[i]);
                prims[i] = PrimRef(refs[i].bounds(),(size_t)refs[i].node);
              }
              return pinfo;
            }, [] (const PrimInfo& a, const PrimInfo& b) { return PrimInfo::merge(a,b); });
#endif   
       
          /* skip if all objects where empty */
          if (pinfo.size() == 0)
            bvh->set(BVH::emptyNode,empty,0);
        
          /* otherwise build toplevel hierarchy */
          else
          {
            /* settings for BVH build */
            GeneralBVHBuilder::Settings settings;
            settings.branchingFactor = N;
            settings.maxDepth = BVH::maxBuildDepthLeaf;
            settings.logBlockSize = bsr(N);
            settings.minLeafSize = 1;
            settings.maxLeafSize = 1;
            settings.travCost = 1.0f;
            settings.intCost = 1.0f;
            settings.singleThreadThreshold = singleThreadThreshold;
      
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            
            refs.resize(extSize); 
         
            NodeRef root = BVHBuilderBinnedOpenMergeSAH::build<NodeRef,BuildRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const BuildRef* refs, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef  {
                assert(range.size() == 1);
                return (NodeRef) refs[range.begin()].node;
              },
              [&] (BuildRef &bref, BuildRef *refs) -> size_t { 
                return openBuildRef(bref,refs);
              },              
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              refs.data(),extSize,pinfo,settings);
#else
            NodeRef root = BVHBuilderBinnedSAH::build<NodeRef>(
              typename BVH::CreateAlloc(bvh),
              typename BVH::AABBNode::Create2(),
              typename BVH::AABBNode::Set2(),
              
              [&] (const PrimRef* prims, const range<size_t>& range, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
                assert(range.size() == 1);
                return (NodeRef) prims[range.begin()].ID();
              },
              [&] (size_t dn) { bvh->scene->progressMonitor(0); },
              prims.data(),pinfo,settings);
#endif

            
            bvh->set(root,LBBox3fa(pinfo.geomBounds),numPrimitives);
          }
        }
      }  
        
      bvh->alloc.cleanup();
      bvh->postBuild(t0);
#if PROFILE
      double d1 = getSeconds();
      std::cout << "TOP_LEVEL OPENING/REBUILD TIME " << 1000.0*(d1-d0) << " ms" << std::endl;
#endif
      }

    }
    
    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::deleteGeometry(size_t geomID)
    {
      if (geomID >= bvh->objects.size()) return;
      if (builders[geomID]) builders[geomID].reset();
      delete bvh->objects [geomID]; bvh->objects [geomID] = nullptr;
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::open_sequential(const size_t extSize)
    {
      if (refs.size() == 0)
	return;

      refs.reserve(extSize);

#if 1
      for (size_t i=0;i<refs.size();i++)
      {
        NodeRef ref = refs[i].node;
        if (ref.isAABBNode())
          BVH::prefetch(ref);
      }
#endif

      std::make_heap(refs.begin(),refs.end());
      while (refs.size()+N-1 <= extSize)
      {
        std::pop_heap (refs.begin(),refs.end()); 
        NodeRef ref = refs.back().node;
        if (ref.isLeaf()) break;
        refs.pop_back();    
        
        AABBNode* node = ref.getAABBNode();
        for (size_t i=0; i<N; i++) {
          if (node->child(i) == BVH::emptyNode) continue;
          refs.push_back(BuildRef(node->bounds(i),node->child(i)));
         
#if 1
          NodeRef ref_pre = node->child(i);
          if (ref_pre.isAABBNode())
            ref_pre.prefetch();
#endif
          std::push_heap (refs.begin(),refs.end()); 
        }
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupSmallBuildRefBuilder (size_t objectID, Mesh const * const /*mesh*/)
    {
      if (builders[objectID] == nullptr ||                                         // new mesh
          dynamic_cast<RefBuilderSmall*>(builders[objectID].get()) == nullptr)     // size change resulted in large->small change
      {
        builders[objectID].reset (new RefBuilderSmall(objectID));
      }
    }

    template<int N, typename Mesh, typename Primitive>
    void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupLargeBuildRefBuilder (size_t objectID, Mesh const * const mesh)
    {
      if (bvh->objects[objectID] == nullptr ||                                  // new mesh
          builders[objectID]->meshQualityChanged (mesh->quality) ||             // changed build quality
          dynamic_cast<RefBuilderLarge*>(builders[objectID].get()) == nullptr)  // size change resulted in small->large change
      {
        Builder* builder = nullptr;
        delete bvh->objects[objectID]; 
        createMeshAccel(objectID, builder);
        builders[objectID].reset (new RefBuilderLarge(objectID, builder, mesh->quality));
      }
    }

#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH4BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4v>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH4BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4i>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH4BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,QuadMesh,Quad4v>((BVH4*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH4BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,UserGeometry,Object>((BVH4*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH4BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,Instance,InstancePrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH4BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,InstanceArray,InstanceArrayPrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(__AVX__)
#if defined(EMBREE_GEOMETRY_TRIANGLE)
    Builder* BVH8BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4vMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4v>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
    Builder* BVH8BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4i>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_QUAD)
    Builder* BVH8BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,QuadMesh,Quad4v>((BVH8*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_USER)
    Builder* BVH8BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,UserGeometry,Object>((BVH8*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE)
    Builder* BVH8BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,Instance,InstancePrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#if defined(EMBREE_GEOMETRY_INSTANCE_ARRAY)
    Builder* BVH8BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,InstanceArray,InstanceArrayPrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }
#endif

#endif
  }